

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O0

atom copy_list(atom list)

{
  anon_union_8_9_1d3277aa_for_value aVar1;
  atom car_val;
  atom aVar2;
  atom aVar3;
  undefined4 uStack_64;
  atom p;
  atom a;
  atom list_local;
  anon_union_8_9_1d3277aa_for_value local_10;
  
  aVar1 = list.value;
  if (list.type == T_NIL) {
    list_local.value = (anon_union_8_9_1d3277aa_for_value)0;
    local_10 = (anon_union_8_9_1d3277aa_for_value)0x0;
  }
  else {
    aVar2._4_4_ = 0;
    aVar2.type = ((aVar1.pair)->car).type;
    aVar2.value.symbol = (aVar1.fp)->_IO_read_ptr;
    aVar2 = cons(aVar2,(atom)ZEXT816(0));
    local_10 = aVar2.value;
    list_local.value._4_4_ = 0;
    list_local.value._0_4_ = aVar2.type;
    a.value = (anon_union_8_9_1d3277aa_for_value)(aVar1.str)->next;
    list_local._0_8_ = (aVar1.fp)->_IO_read_base;
    p._0_8_ = local_10;
    do {
      if (a.value._0_4_ == 0) break;
      car_val._4_4_ = 0;
      car_val.type = *(uint *)list_local._0_8_;
      car_val.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(list_local._0_8_ + 8))->pair;
      aVar2 = cons(car_val,(atom)ZEXT816(0));
      *(ulong *)(p._0_8_ + 0x10) = CONCAT44(uStack_64,aVar2.type);
      *(anon_union_8_9_1d3277aa_for_value *)(p._0_8_ + 0x18) = aVar2.value;
      p._0_8_ = *(undefined8 *)(p._0_8_ + 0x18);
      a.value = *(anon_union_8_9_1d3277aa_for_value *)(list_local._0_8_ + 0x10);
      list_local._0_8_ = *(undefined8 *)(list_local._0_8_ + 0x18);
    } while (a.value._0_4_ == 1);
  }
  aVar3.value.number = local_10.number;
  aVar3._0_8_ = list_local.value.pair;
  return aVar3;
}

Assistant:

atom copy_list(atom list)
{
	atom a, p;

	if (no(list))
		return nil;

	a = cons(car(list), nil);
	p = a;
	list = cdr(list);

	while (!no(list)) {
		cdr(p) = cons(car(list), nil);
		p = cdr(p);
		list = cdr(list);
		if (list.type != T_CONS) { /* improper list */
			p = list;
			break;
		}
	}

	return a;
}